

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testGcSafePoints(void)

{
  Gc *this;
  MutatorThread thread2;
  MutatorThread thread1;
  Gc gc;
  MutatorThread *in_stack_fffffffffffffea0;
  uint64_t in_stack_fffffffffffffeb0;
  Gc *in_stack_fffffffffffffeb8;
  Gc *in_stack_fffffffffffffed0;
  Gc local_110;
  
  Gc::Gc(in_stack_fffffffffffffed0);
  g_gc = &local_110;
  printf("starting mutator threads...\n");
  MutatorThread::MutatorThread(in_stack_fffffffffffffea0);
  MutatorThread::MutatorThread(in_stack_fffffffffffffea0);
  axl::sys::ThreadImpl<MutatorThread>::start((ThreadImpl<MutatorThread> *)0x10f174);
  axl::sys::ThreadImpl<MutatorThread>::start((ThreadImpl<MutatorThread> *)0x10f180);
  this = (Gc *)axl::sys::ThreadImplRoot::getThreadId((ThreadImplRoot *)0x10f18c);
  Gc::registerThread(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  axl::sys::ThreadImplRoot::getThreadId((ThreadImplRoot *)0x10f1ae);
  Gc::registerThread(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  axl::sys::sleep(1000);
  printf("stopping the world...\n");
  Gc::stopTheWorld(this);
  printf("the world is stopped.\n");
  axl::sys::sleep(2000);
  printf("resuming the world...\n");
  Gc::resumeTheWorld(this);
  axl::sys::sleep(1000);
  printf("stopping mutator threads...\n");
  MutatorThread::stop((MutatorThread *)this);
  MutatorThread::stop((MutatorThread *)this);
  printf("done.\n");
  g_gc = (Gc *)0x0;
  MutatorThread::~MutatorThread((MutatorThread *)0x10f27d);
  MutatorThread::~MutatorThread((MutatorThread *)0x10f287);
  Gc::~Gc(this);
  return;
}

Assistant:

void
testGcSafePoints() {
	Gc gc;

	g_gc = &gc;

	printf("starting mutator threads...\n");

	MutatorThread thread1;
	MutatorThread thread2;

	thread1.start();
	thread2.start();

	gc.registerThread(thread1.getThreadId());
	gc.registerThread(thread2.getThreadId());

	sys::sleep(1000);

	printf("stopping the world...\n");
	gc.stopTheWorld();
	printf("the world is stopped.\n");

	sys::sleep(2000);

	printf("resuming the world...\n");
	gc.resumeTheWorld();

	sys::sleep(1000);

	printf("stopping mutator threads...\n");

	thread1.stop();
	thread2.stop();

	printf("done.\n");

	g_gc = NULL;
}